

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dark_magic.h
# Opt level: O2

void cplus::memory::swap<int>(int *a,int *b)

{
  long lVar1;
  byte bVar2;
  char *swapB;
  char *swapA;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    bVar2 = *(byte *)((long)b + lVar1) ^ *(byte *)((long)a + lVar1);
    *(byte *)((long)a + lVar1) = bVar2;
    bVar2 = bVar2 ^ *(byte *)((long)b + lVar1);
    *(byte *)((long)b + lVar1) = bVar2;
    *(byte *)((long)a + lVar1) = *(byte *)((long)a + lVar1) ^ bVar2;
  }
  return;
}

Assistant:

void swap(const T &a, const T &b) {
			char *swapA = (char *) &a;
			char *swapB = (char *) &b;
			for (size_t swapTime = sizeof(a); swapTime > 0; swapTime--) {
				(*swapA) = (*swapA) ^ (*swapB);
				(*swapB) = (*swapA) ^ *(swapB);
				(*swapA) = (*swapA) ^ *(swapB);
				++swapA;
				++swapB;
			}
		}